

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::GetTempDirectories
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list)

{
  size_type *psVar1;
  uint uVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  undefined8 extraout_RAX;
  byte bVar5;
  ulong uVar6;
  undefined1 local_108 [8];
  stat statbuf;
  char *candidates [4];
  undefined1 local_50 [8];
  string dstr;
  
  std::__cxx1998::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&list->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,(list->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  uVar2 = (list->
          super__Safe_container<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_debug::_Safe_sequence,_true>
          ).
          super__Safe_sequence<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .super__Safe_sequence_base._M_version;
  (list->
  super__Safe_container<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_debug::_Safe_sequence,_true>
  ).
  super__Safe_sequence<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .super__Safe_sequence_base._M_version = uVar2 + 1 + (uint)(uVar2 == 0xffffffff);
  __s = getenv("TEST_TMPDIR");
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)__s;
  candidates[0] = getenv("TMPDIR");
  candidates[1] = getenv("TMP");
  psVar1 = &dstr._M_string_length;
  uVar6 = 0;
  candidates[2] = "/tmp";
  do {
    if (__s == (char *)0x0) {
      if (2 < uVar6) {
        return;
      }
    }
    else {
      local_50 = (undefined1  [8])psVar1;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,__s + sVar4);
      if (dstr._M_dataplus._M_p == (pointer)0x0) {
        GetTempDirectories();
        if (local_50 != (undefined1  [8])psVar1) {
          operator_delete((void *)local_50,dstr._M_string_length + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (((pointer)((long)local_50 + -1))[(long)dstr._M_dataplus._M_p] != '/') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"/"
                  );
      }
      std::__debug::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(list,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                 );
      iVar3 = stat(__s,(stat *)local_108);
      if ((iVar3 == 0) && (((uint)statbuf.st_nlink & 0xf000) == 0x4000)) {
        bVar5 = 0;
      }
      else {
        bVar5 = 1;
      }
      if (local_50 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_50,dstr._M_string_length + 1);
      }
      if (!(bool)(bVar5 & uVar6 < 3)) {
        return;
      }
    }
    __s = candidates[uVar6];
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void GetTempDirectories(vector<string>* list) {
  list->clear();
#ifdef GLOG_OS_WINDOWS
  // On windows we'll try to find a directory in this order:
  //   C:/Documents & Settings/whomever/TEMP (or whatever GetTempPath() is)
  //   C:/TMP/
  //   C:/TEMP/
  //   C:/WINDOWS/ or C:/WINNT/
  //   .
  char tmp[MAX_PATH];
  if (GetTempPathA(MAX_PATH, tmp))
    list->push_back(tmp);
  list->push_back("C:\\tmp\\");
  list->push_back("C:\\temp\\");
#else
  // Directories, in order of preference. If we find a dir that
  // exists, we stop adding other less-preferred dirs
  const char * candidates[] = {
    // Non-null only during unittest/regtest
    getenv("TEST_TMPDIR"),

    // Explicitly-supplied temp dirs
    getenv("TMPDIR"), getenv("TMP"),

    // If all else fails
    "/tmp",
  };

  for (size_t i = 0; i < ARRAYSIZE(candidates); i++) {
    const char *d = candidates[i];
    if (!d) continue;  // Empty env var

    // Make sure we don't surprise anyone who's expecting a '/'
    string dstr = d;
    if (dstr[dstr.size() - 1] != '/') {
      dstr += "/";
    }
    list->push_back(dstr);

    struct stat statbuf;
    if (!stat(d, &statbuf) && S_ISDIR(statbuf.st_mode)) {
      // We found a dir that exists - we're done.
      return;
    }
  }

#endif
}